

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valuemapper.hpp
# Opt level: O2

UserObject *
camp_ext::ValueMapper<camp::UserObject,_void>::from
          (UserObject *__return_storage_ptr__,double param_1)

{
  BadType *__return_storage_ptr___00;
  allocator local_a2;
  allocator local_a1;
  string local_a0;
  string local_80;
  BadType local_60;
  
  __return_storage_ptr___00 = (BadType *)__cxa_allocate_exception(0x48);
  camp::BadType::BadType(&local_60,realType,userType);
  std::__cxx11::string::string
            ((string *)&local_80,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/include/camp/valuemapper.hpp"
             ,&local_a1);
  std::__cxx11::string::string
            ((string *)&local_a0,
             "static camp::UserObject camp_ext::ValueMapper<camp::UserObject>::from(double)",
             &local_a2);
  camp::Error::prepare<camp::BadType>(__return_storage_ptr___00,&local_60,&local_80,0x15e,&local_a0)
  ;
  __cxa_throw(__return_storage_ptr___00,&camp::BadType::typeinfo,camp::Error::~Error);
}

Assistant:

static camp::UserObject from(double)                  {CAMP_ERROR(camp::BadType(camp::realType,     camp::userType));}